

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrHandTrackingMeshFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  byte bVar1;
  XrStructureType XVar2;
  pointer pcVar3;
  PFN_xrStructureTypeToString p_Var4;
  void *value_00;
  XrStructureType __val;
  uint uVar5;
  bool bVar6;
  char *pcVar7;
  XrInstance pXVar8;
  invalid_argument *this;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint __len;
  string next_prefix;
  string type_prefix;
  string indexcapacityinput_prefix;
  string vertexblendweights_prefix;
  string vertexuvs_prefix;
  string vertexnormals_prefix;
  string vertexcountoutput_prefix;
  string vertexcapacityinput_prefix;
  string jointparents_prefix;
  string jointradii_prefix;
  string jointbindposes_prefix;
  string jointcountoutput_prefix;
  string indices_prefix;
  string indexcountoutput_prefix;
  string vertexblendindices_prefix;
  string vertexpositions_prefix;
  string jointcapacityinput_prefix;
  ostringstream oss_jointCapacityInput;
  ostringstream oss_jointCountOutput;
  ostringstream oss_indexCountOutput;
  ostringstream oss_indexCapacityInput;
  ostringstream oss_vertexCountOutput;
  ostringstream oss_vertexCapacityInput;
  ostringstream oss_indices;
  ostringstream oss_vertexBlendWeights;
  ostringstream oss_vertexBlendIndices;
  ostringstream oss_vertexUVs;
  ostringstream oss_vertexNormals;
  ostringstream oss_vertexPositions;
  ostringstream oss_jointParents;
  ostringstream oss_jointBindPoses;
  ostringstream oss_jointRadii;
  long *local_1898;
  long local_1890;
  long local_1888 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1698;
  string local_1678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1638;
  undefined8 local_1618;
  undefined8 uStack_1610;
  undefined8 local_1608;
  undefined8 uStack_1600;
  ios_base local_15c8 [264];
  undefined1 local_14c0 [24];
  uint auStack_14a8 [22];
  ios_base local_1450 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1348 [3];
  ios_base local_12d8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11d0 [3];
  ios_base local_1160 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058 [3];
  ios_base local_fe8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee0 [3];
  ios_base local_e70 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d68 [3];
  ios_base local_cf8 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0 [3];
  ios_base local_b80 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78 [3];
  ios_base local_a08 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900 [3];
  ios_base local_890 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788 [3];
  ios_base local_718 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [3];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320 [3];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  local_1638._M_dataplus._M_p = (pointer)&local_1638.field_2;
  local_14c0._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_1638,'\x12');
  *local_1638._M_dataplus._M_p = '0';
  local_1638._M_dataplus._M_p[1] = 'x';
  pcVar7 = local_1638._M_dataplus._M_p + (local_1638._M_string_length - 1);
  lVar10 = 0;
  do {
    bVar1 = local_14c0[lVar10];
    *pcVar7 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 & 0xf];
    pcVar7[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar1 >> 4];
    lVar10 = lVar10 + 1;
    pcVar7 = pcVar7 + -2;
  } while (lVar10 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_1638);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1638._M_dataplus._M_p != &local_1638.field_2) {
    operator_delete(local_1638._M_dataplus._M_p,local_1638.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_1878._M_dataplus._M_p = (pointer)&local_1878.field_2;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1878,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_1878);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar2 = value->type;
    __val = -XVar2;
    if (0 < (int)XVar2) {
      __val = XVar2;
    }
    __len = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar11 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar9 = (uint)uVar11;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_0019261c;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_0019261c;
        }
        if (uVar9 < 10000) goto LAB_0019261c;
        uVar11 = uVar11 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_0019261c:
    local_1638._M_dataplus._M_p = (pointer)&local_1638.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1638,(char)__len - (char)((int)XVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_1638._M_dataplus._M_p + (XVar2 >> 0x1f),__len,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_1878,&local_1638);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1638._M_dataplus._M_p != &local_1638.field_2) {
      operator_delete(local_1638._M_dataplus._M_p,local_1638.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_1608 = 0;
    uStack_1600 = 0;
    local_1618 = 0;
    uStack_1610 = 0;
    local_1638.field_2._M_allocated_capacity = 0;
    local_1638.field_2._8_8_ = 0;
    local_1638._M_dataplus._M_p = (pointer)0x0;
    local_1638._M_string_length = 0;
    p_Var4 = gen_dispatch_table->StructureTypeToString;
    pXVar8 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var4)(pXVar8,value->type,(char *)&local_1638);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_1878,(char (*) [64])&local_1638);
  }
  local_1898 = local_1888;
  pcVar3 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1898,pcVar3,pcVar3 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_1898);
  value_00 = value->next;
  local_1678._M_dataplus._M_p = (pointer)&local_1678.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1678,local_1898,local_1890 + (long)local_1898);
  bVar6 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_1678,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1678._M_dataplus._M_p != &local_1678.field_2) {
    operator_delete(local_1678._M_dataplus._M_p,local_1678.field_2._M_allocated_capacity + 1);
  }
  if (bVar6) {
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_1698._M_dataplus._M_p = (pointer)&local_1698.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1698,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1698);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1638);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1638,"0x",2);
    *(uint *)((long)&local_1638.field_2 + *(long *)(local_1638._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_1638.field_2 + *(long *)(local_1638._M_dataplus._M_p + -0x18) + 8) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1638);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_1698,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14c0);
    if ((XrHandTrackingMeshFB *)local_14c0._0_8_ != (XrHandTrackingMeshFB *)(local_14c0 + 0x10)) {
      operator_delete((void *)local_14c0._0_8_,local_14c0._16_8_ + 1);
    }
    local_1738._M_dataplus._M_p = (pointer)&local_1738.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1738,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1738);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_14c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_14c0,"0x",2);
    *(uint *)((long)auStack_14a8 + (long)*(XrVector4f **)(local_14c0._0_8_ + -0x18)) =
         *(uint *)((long)auStack_14a8 + (long)*(XrVector4f **)(local_14c0._0_8_ + -0x18)) &
         0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_14c0);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_1738,local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
      operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
    }
    local_1758._M_dataplus._M_p = (pointer)&local_1758.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1758,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1758);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
    *(uint *)((long)&local_320[0].field_2 + *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_320[0].field_2 +
                  *(long *)(local_320[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_320);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"XrPosef*",&local_1758,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    local_1778._M_dataplus._M_p = (pointer)&local_1778.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1778,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1778);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    *(undefined8 *)
     ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
         0x20;
    std::ostream::_M_insert<void_const*>(local_1a8);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [7])0x2a7c8c,&local_1778,local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
      operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1);
    }
    local_1798._M_dataplus._M_p = (pointer)&local_1798.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1798,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1798);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_498[0].field_2 +
                  *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_498);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrHandJointEXT*",&local_1798,local_ee0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ee0[0]._M_dataplus._M_p != &local_ee0[0].field_2) {
      operator_delete(local_ee0[0]._M_dataplus._M_p,local_ee0[0].field_2._M_allocated_capacity + 1);
    }
    local_17b8._M_dataplus._M_p = (pointer)&local_17b8.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_17b8,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_17b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ee0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_ee0,"0x",2);
    *(uint *)((long)&local_ee0[0].field_2 + *(long *)(local_ee0[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_ee0[0].field_2 +
                  *(long *)(local_ee0[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_ee0);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_17b8,local_1058);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1058[0]._M_dataplus._M_p != &local_1058[0].field_2) {
      operator_delete(local_1058[0]._M_dataplus._M_p,local_1058[0].field_2._M_allocated_capacity + 1
                     );
    }
    local_17d8._M_dataplus._M_p = (pointer)&local_17d8.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_17d8,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_17d8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1058);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1058,"0x",2);
    *(uint *)((long)&local_1058[0].field_2 + *(long *)(local_1058[0]._M_dataplus._M_p + -0x18) + 8)
         = *(uint *)((long)&local_1058[0].field_2 +
                    *(long *)(local_1058[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1058);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_17d8,local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
      operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_16b8._M_dataplus._M_p = (pointer)&local_16b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_16b8,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_16b8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
    *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_610[0].field_2 +
                  *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_610);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])0x2a72d0,&local_16b8,local_788);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788[0]._M_dataplus._M_p != &local_788[0].field_2) {
      operator_delete(local_788[0]._M_dataplus._M_p,local_788[0].field_2._M_allocated_capacity + 1);
    }
    local_17f8._M_dataplus._M_p = (pointer)&local_17f8.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_17f8,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_17f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_788);
    *(uint *)((long)&local_788[0].field_2 + *(long *)(local_788[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_788[0].field_2 +
                  *(long *)(local_788[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_788);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])0x2a72d0,&local_17f8,local_900);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_900[0]._M_dataplus._M_p != &local_900[0].field_2) {
      operator_delete(local_900[0]._M_dataplus._M_p,local_900[0].field_2._M_allocated_capacity + 1);
    }
    local_1818._M_dataplus._M_p = (pointer)&local_1818.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1818,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1818);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_900);
    *(uint *)((long)&local_900[0].field_2 + *(long *)(local_900[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_900[0].field_2 +
                  *(long *)(local_900[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_900);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"XrVector2f*",&local_1818,local_a78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a78[0]._M_dataplus._M_p != &local_a78[0].field_2) {
      operator_delete(local_a78[0]._M_dataplus._M_p,local_a78[0].field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_16d8._M_dataplus._M_p = (pointer)&local_16d8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_16d8,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_16d8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a78);
    *(uint *)((long)&local_a78[0].field_2 + *(long *)(local_a78[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_a78[0].field_2 +
                  *(long *)(local_a78[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_a78);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[14],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [14])"XrVector4sFB*",&local_16d8,local_bf0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bf0[0]._M_dataplus._M_p != &local_bf0[0].field_2) {
      operator_delete(local_bf0[0]._M_dataplus._M_p,local_bf0[0].field_2._M_allocated_capacity + 1);
    }
    local_1838._M_dataplus._M_p = (pointer)&local_1838.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1838,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1838);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_bf0);
    *(uint *)((long)&local_bf0[0].field_2 + *(long *)(local_bf0[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_bf0[0].field_2 +
                  *(long *)(local_bf0[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_bf0);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [12])"XrVector4f*",&local_1838,local_11d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11d0[0]._M_dataplus._M_p != &local_11d0[0].field_2) {
      operator_delete(local_11d0[0]._M_dataplus._M_p,local_11d0[0].field_2._M_allocated_capacity + 1
                     );
    }
    local_1858._M_dataplus._M_p = (pointer)&local_1858.field_2;
    pcVar3 = (prefix->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1858,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1858);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_11d0,"0x",2);
    *(uint *)((long)&local_11d0[0].field_2 + *(long *)(local_11d0[0]._M_dataplus._M_p + -0x18) + 8)
         = *(uint *)((long)&local_11d0[0].field_2 +
                    *(long *)(local_11d0[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_11d0);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_1858,local_1348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1348[0]._M_dataplus._M_p != &local_1348[0].field_2) {
      operator_delete(local_1348[0]._M_dataplus._M_p,local_1348[0].field_2._M_allocated_capacity + 1
                     );
    }
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_16f8._M_dataplus._M_p = (pointer)&local_16f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_16f8,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_16f8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1348);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1348,"0x",2);
    *(uint *)((long)&local_1348[0].field_2 + *(long *)(local_1348[0]._M_dataplus._M_p + -0x18) + 8)
         = *(uint *)((long)&local_1348[0].field_2 +
                    *(long *)(local_1348[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)local_1348);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&local_16f8,local_d68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d68[0]._M_dataplus._M_p != &local_d68[0].field_2) {
      operator_delete(local_d68[0]._M_dataplus._M_p,local_d68[0].field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (prefix->_M_dataplus)._M_p;
    local_1718._M_dataplus._M_p = (pointer)&local_1718.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1718,pcVar3,pcVar3 + prefix->_M_string_length);
    std::__cxx11::string::append((char *)&local_1718);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d68);
    *(uint *)((long)&local_d68[0].field_2 + *(long *)(local_d68[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_d68[0].field_2 +
                  *(long *)(local_d68[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(local_d68);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])0x2a6df8,&local_1718,&local_1658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1658._M_dataplus._M_p != &local_1658.field_2) {
      operator_delete(local_1658._M_dataplus._M_p,local_1658.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d68);
    std::ios_base::~ios_base(local_cf8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1718._M_dataplus._M_p != &local_1718.field_2) {
      operator_delete(local_1718._M_dataplus._M_p,local_1718.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1348);
    std::ios_base::~ios_base(local_12d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16f8._M_dataplus._M_p != &local_16f8.field_2) {
      operator_delete(local_16f8._M_dataplus._M_p,local_16f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_11d0);
    std::ios_base::~ios_base(local_1160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1858._M_dataplus._M_p != &local_1858.field_2) {
      operator_delete(local_1858._M_dataplus._M_p,local_1858.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_bf0);
    std::ios_base::~ios_base(local_b80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1838._M_dataplus._M_p != &local_1838.field_2) {
      operator_delete(local_1838._M_dataplus._M_p,local_1838.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a78);
    std::ios_base::~ios_base(local_a08);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16d8._M_dataplus._M_p != &local_16d8.field_2) {
      operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_900);
    std::ios_base::~ios_base(local_890);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1818._M_dataplus._M_p != &local_1818.field_2) {
      operator_delete(local_1818._M_dataplus._M_p,local_1818.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_788);
    std::ios_base::~ios_base(local_718);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_17f8._M_dataplus._M_p != &local_17f8.field_2) {
      operator_delete(local_17f8._M_dataplus._M_p,local_17f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
    std::ios_base::~ios_base(local_5a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16b8._M_dataplus._M_p != &local_16b8.field_2) {
      operator_delete(local_16b8._M_dataplus._M_p,local_16b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1058);
    std::ios_base::~ios_base(local_fe8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_17d8._M_dataplus._M_p != &local_17d8.field_2) {
      operator_delete(local_17d8._M_dataplus._M_p,local_17d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ee0);
    std::ios_base::~ios_base(local_e70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_17b8._M_dataplus._M_p != &local_17b8.field_2) {
      operator_delete(local_17b8._M_dataplus._M_p,local_17b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1798._M_dataplus._M_p != &local_1798.field_2) {
      operator_delete(local_1798._M_dataplus._M_p,local_1798.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1778._M_dataplus._M_p != &local_1778.field_2) {
      operator_delete(local_1778._M_dataplus._M_p,local_1778.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
    std::ios_base::~ios_base(local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1758._M_dataplus._M_p != &local_1758.field_2) {
      operator_delete(local_1758._M_dataplus._M_p,local_1758.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_14c0);
    std::ios_base::~ios_base(local_1450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1738._M_dataplus._M_p != &local_1738.field_2) {
      operator_delete(local_1738._M_dataplus._M_p,local_1738.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1638);
    std::ios_base::~ios_base(local_15c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1698._M_dataplus._M_p != &local_1698.field_2) {
      operator_delete(local_1698._M_dataplus._M_p,local_1698.field_2._M_allocated_capacity + 1);
    }
    if (local_1898 != local_1888) {
      operator_delete(local_1898,local_1888[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1878._M_dataplus._M_p != &local_1878.field_2) {
      operator_delete(local_1878._M_dataplus._M_p,local_1878.field_2._M_allocated_capacity + 1);
    }
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrHandTrackingMeshFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string jointcapacityinput_prefix = prefix;
        jointcapacityinput_prefix += "jointCapacityInput";
        std::ostringstream oss_jointCapacityInput;
        oss_jointCapacityInput << "0x" << std::hex << (value->jointCapacityInput);
        contents.emplace_back("uint32_t", jointcapacityinput_prefix, oss_jointCapacityInput.str());
        std::string jointcountoutput_prefix = prefix;
        jointcountoutput_prefix += "jointCountOutput";
        std::ostringstream oss_jointCountOutput;
        oss_jointCountOutput << "0x" << std::hex << (value->jointCountOutput);
        contents.emplace_back("uint32_t", jointcountoutput_prefix, oss_jointCountOutput.str());
        std::string jointbindposes_prefix = prefix;
        jointbindposes_prefix += "jointBindPoses";
        std::ostringstream oss_jointBindPoses;
        oss_jointBindPoses << std::hex << reinterpret_cast<const void*>(value->jointBindPoses);
        contents.emplace_back("XrPosef*", jointbindposes_prefix, oss_jointBindPoses.str());
        std::string jointradii_prefix = prefix;
        jointradii_prefix += "jointRadii";
        std::ostringstream oss_jointRadii;
        oss_jointRadii << std::setprecision(32) << (value->jointRadii);
        contents.emplace_back("float*", jointradii_prefix, oss_jointRadii.str());
        std::string jointparents_prefix = prefix;
        jointparents_prefix += "jointParents";
        std::ostringstream oss_jointParents;
        oss_jointParents << std::hex << reinterpret_cast<const void*>(value->jointParents);
        contents.emplace_back("XrHandJointEXT*", jointparents_prefix, oss_jointParents.str());
        std::string vertexcapacityinput_prefix = prefix;
        vertexcapacityinput_prefix += "vertexCapacityInput";
        std::ostringstream oss_vertexCapacityInput;
        oss_vertexCapacityInput << "0x" << std::hex << (value->vertexCapacityInput);
        contents.emplace_back("uint32_t", vertexcapacityinput_prefix, oss_vertexCapacityInput.str());
        std::string vertexcountoutput_prefix = prefix;
        vertexcountoutput_prefix += "vertexCountOutput";
        std::ostringstream oss_vertexCountOutput;
        oss_vertexCountOutput << "0x" << std::hex << (value->vertexCountOutput);
        contents.emplace_back("uint32_t", vertexcountoutput_prefix, oss_vertexCountOutput.str());
        std::string vertexpositions_prefix = prefix;
        vertexpositions_prefix += "vertexPositions";
        std::ostringstream oss_vertexPositions;
        oss_vertexPositions << std::hex << reinterpret_cast<const void*>(value->vertexPositions);
        contents.emplace_back("XrVector3f*", vertexpositions_prefix, oss_vertexPositions.str());
        std::string vertexnormals_prefix = prefix;
        vertexnormals_prefix += "vertexNormals";
        std::ostringstream oss_vertexNormals;
        oss_vertexNormals << std::hex << reinterpret_cast<const void*>(value->vertexNormals);
        contents.emplace_back("XrVector3f*", vertexnormals_prefix, oss_vertexNormals.str());
        std::string vertexuvs_prefix = prefix;
        vertexuvs_prefix += "vertexUVs";
        std::ostringstream oss_vertexUVs;
        oss_vertexUVs << std::hex << reinterpret_cast<const void*>(value->vertexUVs);
        contents.emplace_back("XrVector2f*", vertexuvs_prefix, oss_vertexUVs.str());
        std::string vertexblendindices_prefix = prefix;
        vertexblendindices_prefix += "vertexBlendIndices";
        std::ostringstream oss_vertexBlendIndices;
        oss_vertexBlendIndices << std::hex << reinterpret_cast<const void*>(value->vertexBlendIndices);
        contents.emplace_back("XrVector4sFB*", vertexblendindices_prefix, oss_vertexBlendIndices.str());
        std::string vertexblendweights_prefix = prefix;
        vertexblendweights_prefix += "vertexBlendWeights";
        std::ostringstream oss_vertexBlendWeights;
        oss_vertexBlendWeights << std::hex << reinterpret_cast<const void*>(value->vertexBlendWeights);
        contents.emplace_back("XrVector4f*", vertexblendweights_prefix, oss_vertexBlendWeights.str());
        std::string indexcapacityinput_prefix = prefix;
        indexcapacityinput_prefix += "indexCapacityInput";
        std::ostringstream oss_indexCapacityInput;
        oss_indexCapacityInput << "0x" << std::hex << (value->indexCapacityInput);
        contents.emplace_back("uint32_t", indexcapacityinput_prefix, oss_indexCapacityInput.str());
        std::string indexcountoutput_prefix = prefix;
        indexcountoutput_prefix += "indexCountOutput";
        std::ostringstream oss_indexCountOutput;
        oss_indexCountOutput << "0x" << std::hex << (value->indexCountOutput);
        contents.emplace_back("uint32_t", indexcountoutput_prefix, oss_indexCountOutput.str());
        std::string indices_prefix = prefix;
        indices_prefix += "indices";
        std::ostringstream oss_indices;
        oss_indices << std::hex << reinterpret_cast<const void*>(value->indices);
        contents.emplace_back("int16_t*", indices_prefix, oss_indices.str());
        return true;
    } catch(...) {
    }
    return false;
}